

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O1

int bcache_write(filemgr *file,bid_t bid,void *buf,bcache_dirty_t dirty,bool final_write,
                bool ignore_if_exist)

{
  bcache_shard *__lock;
  char cVar1;
  byte bVar2;
  ulong uVar3;
  bcache_shard *pbVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  fdb_status fVar8;
  fnamedic_item *pfVar9;
  hash_elem *phVar10;
  list_elem *plVar11;
  fnamedic_item *fname_item;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  avl_tree *tree;
  bcache_item *item;
  ulong uVar16;
  timeval tp;
  bcache_item query;
  bcache_item *local_90;
  timeval local_80;
  bid_t local_70;
  hash_elem local_60 [2];
  
  pfVar9 = (file->bcache)._M_b._M_p;
  if (pfVar9 == (fnamedic_item *)0x0) {
    pthread_spin_lock(&bcache_lock);
    pfVar9 = (file->bcache)._M_b._M_p;
    if (pfVar9 == (fnamedic_item *)0x0) {
      pfVar9 = _fname_create(file);
    }
    pthread_spin_unlock(&bcache_lock);
  }
  gettimeofday(&local_80,(__timezone_ptr_t)0x0);
  (pfVar9->access_timestamp).super___atomic_base<unsigned_long>._M_i =
       local_80.tv_sec * 1000000 + local_80.tv_usec;
  uVar14 = bid % pfVar9->num_shards;
  local_70 = bid;
  pthread_spin_lock(&pfVar9->shards[uVar14].lock);
  phVar10 = hash_find(&pfVar9->shards[uVar14].hashtable,local_60);
  if (phVar10 == (hash_elem *)0x0) {
    while( true ) {
      pthread_spin_lock(&freelist_lock);
      plVar11 = list_pop_front(&freelist);
      if (plVar11 == (list_elem *)0x0) {
        pthread_spin_unlock(&freelist_lock);
        item = (bcache_item *)0x0;
      }
      else {
        LOCK();
        freelist_count.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)freelist_count.super___atomic_base<unsigned_long>._M_i + -1);
        UNLOCK();
        pthread_spin_unlock(&freelist_lock);
        item = (bcache_item *)&plVar11[-3].next;
      }
      if (item != (bcache_item *)0x0) break;
      pthread_spin_unlock(&pfVar9->shards[uVar14].lock);
      do {
        fname_item = _bcache_get_victim();
        if ((fname_item != (fnamedic_item *)0x0) &&
           ((fname_item->nitems).super___atomic_base<unsigned_long>._M_i == 0)) {
          LOCK();
          (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i =
               (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i - 1;
          UNLOCK();
          fname_item = (fnamedic_item *)0x0;
        }
      } while (fname_item == (fnamedic_item *)0x0);
      LOCK();
      (fname_item->nvictim).super___atomic_base<unsigned_long>._M_i =
           (fname_item->nvictim).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      bVar5 = false;
      do {
        if (bVar5) goto LAB_0010730d;
        uVar3 = fname_item->num_shards;
        iVar7 = rand();
        uVar15 = (ulong)(long)iVar7 % uVar3;
        uVar16 = uVar3;
        do {
          uVar12 = uVar15 + 1;
          uVar15 = 0;
          if (uVar12 != uVar3) {
            uVar15 = uVar12;
          }
          pbVar4 = fname_item->shards;
          __lock = pbVar4 + uVar15;
          pthread_spin_lock(&__lock->lock);
          if (((pbVar4[uVar15].cleanlist.head == (list_elem *)0x0) &&
              ((__lock->tree).root == (avl_node *)0x0)) &&
             ((__lock->tree_idx).root == (avl_node *)0x0)) {
LAB_00107252:
            pthread_spin_unlock(&__lock->lock);
          }
          else {
            plVar11 = list_pop_back(&pbVar4[uVar15].cleanlist);
            if (plVar11 != (list_elem *)0x0) {
              local_90 = (bcache_item *)&plVar11[-3].next;
              cVar1 = *(char *)((long)&plVar11[1].prev + 1);
              bVar5 = true;
              if ((cVar1 != '\0') && (bcache_global_config.do_not_cache_doc_blocks == false)) {
                *(char *)((long)&plVar11[1].prev + 1) = cVar1 + -1;
                list_push_front(&pbVar4[uVar15].cleanlist,plVar11);
                goto LAB_00107252;
              }
              goto LAB_00107293;
            }
            pthread_spin_unlock(&__lock->lock);
            fVar8 = _flush_dirty_blocks(fname_item,true,false,false);
            if (fVar8 != FDB_RESULT_SUCCESS) {
              LOCK();
              (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i =
                   (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i - 1;
              UNLOCK();
              iVar7 = 1;
              bVar5 = false;
              bVar6 = false;
              goto LAB_00107295;
            }
          }
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        bVar5 = false;
LAB_00107293:
        iVar7 = 8;
        bVar6 = true;
LAB_00107295:
        if (bVar6) {
          if (!bVar5) {
            LOCK();
            (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i =
                 (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i - 1;
            UNLOCK();
            iVar7 = 1;
            goto LAB_001072ed;
          }
          LOCK();
          (fname_item->nitems).super___atomic_base<unsigned_long>._M_i =
               (fname_item->nitems).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          hash_remove(&__lock->hashtable,&local_90->hash_elem);
          _bcache_release_freeblock(local_90);
          pthread_spin_unlock(&__lock->lock);
          iVar7 = 0;
          if ((fname_item->nitems).super___atomic_base<unsigned_long>._M_i == 0) {
            iVar7 = 7;
          }
          bVar5 = true;
        }
        else {
LAB_001072ed:
          bVar5 = false;
        }
      } while (iVar7 == 0);
      if (iVar7 == 7) {
LAB_0010730d:
        LOCK();
        (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i =
             (fname_item->ref_count).super___atomic_base<unsigned_int>._M_i - 1;
        UNLOCK();
      }
      pthread_spin_lock(&pfVar9->shards[uVar14].lock);
    }
    phVar10 = hash_find(&pfVar9->shards[uVar14].hashtable,local_60);
    if (phVar10 == (hash_elem *)0x0) {
      item->bid = bid;
      LOCK();
      (item->flag).super___atomic_base<unsigned_char>._M_i = '\x04';
      UNLOCK();
      hash_insert(&pfVar9->shards[uVar14].hashtable,&item->hash_elem);
    }
    else {
      _bcache_release_freeblock(item);
      item = (bcache_item *)&phVar10[-1].avl.left;
    }
  }
  else {
    if (ignore_if_exist) {
      pthread_spin_unlock(&pfVar9->shards[uVar14].lock);
      return 0;
    }
    item = (bcache_item *)&phVar10[-1].avl.left;
  }
  if (((item->flag).super___atomic_base<unsigned_char>._M_i & 4) != 0) {
    LOCK();
    (pfVar9->nitems).super___atomic_base<unsigned_long>._M_i =
         (pfVar9->nitems).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((((item->flag).super___atomic_base<unsigned_char>._M_i & 1) == 0) &&
     (((item->flag).super___atomic_base<unsigned_char>._M_i & 4) == 0)) {
    list_remove(&pfVar9->shards[uVar14].cleanlist,&item->list_elem);
  }
  LOCK();
  (item->flag).super___atomic_base<unsigned_char>._M_i =
       (item->flag).super___atomic_base<unsigned_char>._M_i & 0xfb;
  UNLOCK();
  bVar2 = (item->flag).super___atomic_base<unsigned_char>._M_i;
  if (dirty == BCACHE_REQ_DIRTY) {
    if ((bVar2 & 1) == 0) {
      puVar13 = (undefined8 *)malloc(0x20);
      *puVar13 = item;
      if (*(char *)((long)buf + (long)bcache_blocksize + -1) == -1) {
        tree = &pfVar9->shards[uVar14].tree_idx;
      }
      else {
        if (final_write) {
          LOCK();
          (item->flag).super___atomic_base<unsigned_char>._M_i =
               (item->flag).super___atomic_base<unsigned_char>._M_i | 2;
          UNLOCK();
          LOCK();
          (pfVar9->nimmutable).super___atomic_base<unsigned_long>._M_i =
               (pfVar9->nimmutable).super___atomic_base<unsigned_long>._M_i + 1;
          UNLOCK();
        }
        tree = &pfVar9->shards[uVar14].tree;
      }
      avl_insert(tree,(avl_node *)(puVar13 + 1),_dirty_cmp);
    }
    LOCK();
    (item->flag).super___atomic_base<unsigned_char>._M_i =
         (item->flag).super___atomic_base<unsigned_char>._M_i | 1;
    UNLOCK();
  }
  else if ((bVar2 & 1) == 0) {
    list_push_front(&pfVar9->shards[uVar14].cleanlist,&item->list_elem);
    LOCK();
    (item->flag).super___atomic_base<unsigned_char>._M_i =
         (item->flag).super___atomic_base<unsigned_char>._M_i & 0xfe;
    UNLOCK();
  }
  memcpy((avl_node *)item->addr,buf,(long)bcache_blocksize);
  item->score = *(char *)((long)item->addr + (long)bcache_blocksize + -1) == -1;
  pthread_spin_unlock(&pfVar9->shards[uVar14].lock);
  return bcache_blocksize;
}

Assistant:

int bcache_write(struct filemgr *file,
                 bid_t bid,
                 void *buf,
                 bcache_dirty_t dirty,
                 bool final_write,
                 bool ignore_if_exist)
{
    struct hash_elem *h = NULL;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname_new;

    fname_new = file->bcache;
    if (fname_new == NULL) {
        spin_lock(&bcache_lock);
        fname_new = file->bcache;
        if (fname_new == NULL) {
            // filename doesn't exist in filename dictionary .. create
            fname_new = _fname_create(file);
        }
        spin_unlock(&bcache_lock);
    }

    // Update the access timestamp.
    struct timeval tp;
    gettimeofday(&tp, NULL);
    atomic_store_uint64_t(&fname_new->access_timestamp,
                          (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                          std::memory_order_relaxed);

    size_t shard_num = bid % fname_new->num_shards;
    // set query
    query.bid = bid;

    spin_lock(&fname_new->shards[shard_num].lock);

    // search hash table
    h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
    if (h == NULL) {
        // cache miss
        // get a free block
        while ((item = _bcache_alloc_freeblock()) == NULL) {
            // no free block .. perform eviction
            spin_unlock(&fname_new->shards[shard_num].lock);

            _bcache_evict(fname_new);

            spin_lock(&fname_new->shards[shard_num].lock);
        }

        // re-search hash table
        h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
        if (h == NULL) {
            // insert into hash table
            item->bid = bid;
            item->flag = BCACHE_FREE;
            hash_insert(&fname_new->shards[shard_num].hashtable, &item->hash_elem);
            h = &item->hash_elem;
        } else {
            // insert into freelist again
            _bcache_release_freeblock(item);
            item = _get_entry(h, struct bcache_item, hash_elem);
        }
    } else {
        // cache hit.
        if (ignore_if_exist) {
            spin_unlock(&fname_new->shards[shard_num].lock);
            return 0;
        }
        item = _get_entry(h, struct bcache_item, hash_elem);
    }

    fdb_assert(h, h, NULL);

    if (item->flag & BCACHE_FREE) {
        atomic_incr_uint64_t(&fname_new->nitems);
    }

    // remove from the list if the block is in clean list
    if (!(item->flag & BCACHE_DIRTY) && !(item->flag & BCACHE_FREE)) {
        list_remove(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
    }
    item->flag &= ~BCACHE_FREE;

    if (dirty == BCACHE_REQ_DIRTY) {
        // DIRTY request
        // to avoid re-insert already existing item into tree
        if (!(item->flag & BCACHE_DIRTY)) {
            // dirty block
            // insert into tree
            struct dirty_item *ditem;
            uint8_t marker;

            ditem = (struct dirty_item *)
                    mempool_alloc(sizeof(struct dirty_item));
            ditem->item = item;

            marker = *((uint8_t*)buf + bcache_blocksize-1);
            if (marker == BLK_MARKER_BNODE) {
                // b-tree node
                avl_insert(&fname_new->shards[shard_num].tree_idx, &ditem->avl, _dirty_cmp);
            } else {
                if (final_write) {
                    item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
                    atomic_incr_uint64_t(&fname_new->nimmutable);
                }
                avl_insert(&fname_new->shards[shard_num].tree, &ditem->avl,
                           _dirty_cmp);
            }
        }
        item->flag |= BCACHE_DIRTY;
    } else {
        // CLEAN request
        // insert into clean list only when it was originally clean
        if (!(item->flag & BCACHE_DIRTY)) {
            list_push_front(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
            item->flag &= ~(BCACHE_DIRTY);
        }
    }

    memcpy(item->addr, buf, bcache_blocksize);
    _bcache_set_score(item);

    spin_unlock(&fname_new->shards[shard_num].lock);

    return bcache_blocksize;
}